

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O0

double __thiscall ON_ProgressStepCounter::Progress(ON_ProgressStepCounter *this)

{
  double dVar1;
  double s;
  ON_ProgressStepCounter *this_local;
  
  if (this->m_step_index == 0) {
    this_local = (ON_ProgressStepCounter *)this->m_progress_interval_start;
  }
  else if (this->m_step_index < this->m_step_count) {
    dVar1 = (double)this->m_step_index / (double)this->m_step_count;
    this_local = (ON_ProgressStepCounter *)
                 ((1.0 - dVar1) * this->m_progress_interval_start +
                 dVar1 * this->m_progress_interval_finish);
  }
  else {
    this_local = (ON_ProgressStepCounter *)this->m_progress_interval_finish;
  }
  return (double)this_local;
}

Assistant:

double ON_ProgressStepCounter::Progress() const
{
  if (m_step_index <= 0)
    return m_progress_interval_start;
  if (m_step_index >= m_step_count)
    return m_progress_interval_finish;
  const double s = ((double)m_step_index)/((double)m_step_count);
  return (1.0 - s)*m_progress_interval_start + s*m_progress_interval_finish;
}